

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

void readsf_dsp(t_readsf *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = x->x_noutlets;
  pthread_mutex_lock((pthread_mutex_t *)&x->x_mutex);
  iVar2 = (*sp)->s_n;
  iVar3 = (x->x_sf).sf_bytesperframe;
  x->x_vecsize = iVar2;
  x->x_sigperiod = x->x_fifosize / (iVar3 * iVar2);
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      x->x_outvec[lVar4] = sp[lVar4]->s_vec;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&x->x_mutex);
  dsp_add(readsf_perform,1,x);
  return;
}

Assistant:

static void readsf_dsp(t_readsf *x, t_signal **sp)
{
    int i, noutlets = x->x_noutlets;
    pthread_mutex_lock(&x->x_mutex);
    x->x_vecsize = sp[0]->s_n;
    x->x_sigperiod = x->x_fifosize / (x->x_sf.sf_bytesperframe * x->x_vecsize);
    for (i = 0; i < noutlets; i++)
        x->x_outvec[i] = sp[i]->s_vec;
    pthread_mutex_unlock(&x->x_mutex);
    dsp_add(readsf_perform, 1, x);
}